

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

WebPDecBuffer * GetOutputBuffer(WebPIDecoder *idec)

{
  WebPIDecoder *idec_local;
  WebPDecBuffer *local_8;
  
  if ((idec == (WebPIDecoder *)0x0) || (idec->dec == (void *)0x0)) {
    local_8 = (WebPDecBuffer *)0x0;
  }
  else if (idec->state < STATE_VP8_DATA) {
    local_8 = (WebPDecBuffer *)0x0;
  }
  else if (idec->final_output == (WebPDecBuffer *)0x0) {
    local_8 = (idec->params).output;
  }
  else {
    local_8 = (WebPDecBuffer *)0x0;
  }
  return local_8;
}

Assistant:

static const WebPDecBuffer* GetOutputBuffer(const WebPIDecoder* const idec) {
  if (idec == NULL || idec->dec == NULL) {
    return NULL;
  }
  if (idec->state <= STATE_VP8_PARTS0) {
    return NULL;
  }
  if (idec->final_output != NULL) {
    return NULL;   // not yet slow-copied
  }
  return idec->params.output;
}